

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bte.cpp
# Opt level: O2

void __thiscall merlin::bte::run(bte *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  undefined4 extraout_var;
  char *pcVar6;
  vindex v_1;
  ulong uVar7;
  vindex v;
  ulong uVar8;
  vindex v_2;
  double dVar9;
  reference rVar10;
  ostream *local_38;
  
  dVar9 = timeSystem();
  (this->super_algorithm).m_start_time = dVar9;
  (*(this->super_graphical_model)._vptr_graphical_model[0x10])(this);
  propagate(this);
  local_38 = (ostream *)&std::cout;
  std::operator<<((ostream *)&std::cout,"[BTE] Finished in ");
  dVar9 = timeSystem();
  poVar4 = std::ostream::_M_insert<double>(dVar9 - (this->super_algorithm).m_start_time);
  poVar4 = std::operator<<(poVar4," seconds");
  std::endl<char,std::char_traits<char>>(poVar4);
  switch((this->m_task).t_) {
  case PR:
    poVar4 = std::operator<<((ostream *)&std::cout,"PR");
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar1 = std::cout;
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)(operator_delete__ + *(long *)(lVar1 + -0x18)) = 6;
    poVar4 = std::ostream::_M_insert<double>(this->m_logz);
    poVar4 = std::operator<<(poVar4," (");
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 6;
    dVar9 = exp(this->m_logz);
    poVar4 = std::ostream::_M_insert<double>(dVar9);
    poVar4 = std::operator<<(poVar4,")");
    std::endl<char,std::char_traits<char>>(poVar4);
    dVar9 = this->m_logz;
    poVar4 = std::operator<<((ostream *)&std::cout,"STATUS");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar6 = "true: Consistent evidence";
    if (ABS(dVar9) == INFINITY) {
      pcVar6 = "false: Inconsistent evidence or underflow";
    }
    local_38 = std::operator<<((ostream *)&std::cout,pcVar6);
    break;
  case MAR:
    poVar4 = std::operator<<((ostream *)&std::cout,"PR");
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar1 = std::cout;
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)(operator_delete__ + *(long *)(lVar1 + -0x18)) = 6;
    poVar4 = std::ostream::_M_insert<double>(this->m_logz);
    poVar4 = std::operator<<(poVar4," (");
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 6;
    dVar9 = exp(this->m_logz);
    poVar4 = std::ostream::_M_insert<double>(dVar9);
    poVar4 = std::operator<<(poVar4,")");
    std::endl<char,std::char_traits<char>>(poVar4);
    dVar9 = this->m_logz;
    poVar4 = std::operator<<((ostream *)&std::cout,"STATUS");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar6 = "true: Consistent evidence";
    if (ABS(dVar9) == INFINITY) {
      pcVar6 = "false: Inconsistent evidence or underflow";
    }
    poVar4 = std::operator<<((ostream *)&std::cout,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"MAR");
    std::endl<char,std::char_traits<char>>(poVar4);
    local_38 = (ostream *)&std::cout;
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    for (uVar7 = 0;
        uVar7 < (ulong)((long)(this->m_gmo).m_vadj.
                              super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_gmo).m_vadj.
                              super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
      dVar9 = (this->m_gmo).m_dims.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      uVar5 = (ulong)dVar9;
      uVar5 = (long)(dVar9 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
      poVar4 = std::operator<<((ostream *)&std::cout," ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        poVar4 = std::operator<<((ostream *)&std::cout," ");
        lVar1 = *(long *)poVar4;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xfffffefb | 4;
        *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 6;
        iVar3 = (*(this->super_graphical_model)._vptr_graphical_model[0xb])(this,uVar7,uVar5);
        std::ostream::_M_insert<double>
                  (*(double *)(*(long *)(CONCAT44(extraout_var,iVar3) + 0x40) + uVar8 * 8));
      }
    }
    break;
  case MAP:
    poVar4 = std::operator<<((ostream *)&std::cout,"Value");
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar1 = std::cout;
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)(operator_delete__ + *(long *)(lVar1 + -0x18)) = 6;
    poVar4 = std::ostream::_M_insert<double>(this->m_logz);
    poVar4 = std::operator<<(poVar4," (");
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 6;
    dVar9 = exp(this->m_logz);
    poVar4 = std::ostream::_M_insert<double>(dVar9);
    poVar4 = std::operator<<(poVar4,")");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"MAP");
    std::endl<char,std::char_traits<char>>(poVar4);
    local_38 = (ostream *)&std::cout;
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    for (uVar7 = 0;
        uVar7 < (ulong)((long)(this->m_gmo).m_vadj.
                              super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_gmo).m_vadj.
                              super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
      poVar4 = std::operator<<((ostream *)&std::cout," ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    }
    break;
  case MMAP:
    poVar4 = std::operator<<((ostream *)&std::cout,"Value");
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar1 = std::cout;
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)(operator_delete__ + *(long *)(lVar1 + -0x18)) = 6;
    poVar4 = std::ostream::_M_insert<double>(this->m_logz);
    poVar4 = std::operator<<(poVar4," (");
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 6;
    dVar9 = exp(this->m_logz);
    poVar4 = std::ostream::_M_insert<double>(dVar9);
    poVar4 = std::operator<<(poVar4,")");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"MMAP");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    for (uVar7 = 0;
        uVar7 < (ulong)((long)(this->m_gmo).m_vadj.
                              super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_gmo).m_vadj.
                              super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->m_var_types,uVar7);
      if ((*rVar10._M_p & rVar10._M_mask) != 0) {
        poVar4 = std::operator<<((ostream *)&std::cout," ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      }
    }
    break;
  default:
    return;
  }
  std::endl<char,std::char_traits<char>>(local_38);
  return;
}

Assistant:

void bte::run() {

	// Start the timer and store it
	m_start_time = timeSystem();

	init();
	propagate();

	// Output solution (UAI output format)
	std::cout << "[BTE] Finished in " << (timeSystem() - m_start_time)
			<< " seconds" << std::endl;


	switch (m_task) {
	case Task::PR:	// partition function
		{
			std::cout << "PR" << std::endl;
			std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ")" << std::endl;

			if (isinf(m_logz)) {
				std::cout << "STATUS" << std::endl;
				std::cout << "false: Inconsistent evidence or underflow" << std::endl;
			} else {
				std::cout << "STATUS" << std::endl;
				std::cout << "true: Consistent evidence" << std::endl;
			}

			break;
		}
	case Task::MAR:	// marginals
		{
			std::cout << "PR" << std::endl;
			std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ")" << std::endl;

			if (isinf(m_logz)) {
				std::cout << "STATUS" << std::endl;
				std::cout << "false: Inconsistent evidence or underflow" << std::endl;
			} else {
				std::cout << "STATUS" << std::endl;
				std::cout << "true: Consistent evidence" << std::endl;
			}

			std::cout << "MAR" << std::endl;
			std::cout << m_gmo.nvar();
			for (vindex v = 0; v < m_gmo.nvar(); ++v) {
				variable VX = m_gmo.var(v);
				std::cout << " " << VX.states();
				for (size_t k = 0; k < VX.states(); ++k) {
					std::cout << " " << std::fixed
						<< std::setprecision(MERLIN_PRECISION)
						<< belief(VX)[k];
				}
			}
			std::cout << std::endl;

			break;
		}
	case Task::MAP: // MAP inference
		{
			std::cout << "Value" << std::endl;
			std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ")" << std::endl;

			std::cout << "MAP" << std::endl;
			std::cout << m_gmo.nvar();
			for (vindex v = 0; v < m_gmo.nvar(); ++v) {
				std::cout << " " << m_best_config[v];
			}
			std::cout << std::endl;

			break;
		}
	case Task::MMAP: // Marginal MAP inference
		{
			std::cout << "Value" << std::endl;
			std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ")" << std::endl;

			std::cout << "MMAP" << std::endl;
			std::cout << m_query.size();
			for (vindex v = 0; v < m_gmo.nvar(); ++v) {
				if (m_var_types[v] == true)
					std::cout << " " << m_best_config[v];
			}
			std::cout << std::endl;

			break;
		}
	}

}